

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O1

void __thiscall
QHttpNetworkRequestPrivate::QHttpNetworkRequestPrivate
          (QHttpNetworkRequestPrivate *this,QHttpNetworkRequestPrivate *other)

{
  Data *pDVar1;
  Data *pDVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  RedirectPolicy RVar10;
  
  QHttpNetworkHeaderPrivate::QHttpNetworkHeaderPrivate
            (&this->super_QHttpNetworkHeaderPrivate,&other->super_QHttpNetworkHeaderPrivate);
  this->operation = other->operation;
  pDVar1 = (other->customVerb).d.d;
  (this->customVerb).d.d = pDVar1;
  (this->customVerb).d.ptr = (other->customVerb).d.ptr;
  (this->customVerb).d.size = (other->customVerb).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar2 = (other->fullLocalServerName).d.d;
  (this->fullLocalServerName).d.d = pDVar2;
  (this->fullLocalServerName).d.ptr = (other->fullLocalServerName).d.ptr;
  (this->fullLocalServerName).d.size = (other->fullLocalServerName).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this->priority = other->priority;
  this->uploadByteDevice = other->uploadByteDevice;
  bVar3 = other->pipeliningAllowed;
  bVar4 = other->http2Allowed;
  bVar5 = other->http2Direct;
  bVar6 = other->h2cAllowed;
  bVar7 = other->withCredentials;
  bVar8 = other->ssl;
  bVar9 = other->preConnect;
  this->autoDecompress = other->autoDecompress;
  this->pipeliningAllowed = bVar3;
  this->http2Allowed = bVar4;
  this->http2Direct = bVar5;
  this->h2cAllowed = bVar6;
  this->withCredentials = bVar7;
  this->ssl = bVar8;
  this->preConnect = bVar9;
  this->needResendWithCredentials = other->needResendWithCredentials;
  RVar10 = other->redirectPolicy;
  this->redirectCount = other->redirectCount;
  this->redirectPolicy = RVar10;
  pDVar2 = (other->peerVerifyName).d.d;
  (this->peerVerifyName).d.d = pDVar2;
  (this->peerVerifyName).d.ptr = (other->peerVerifyName).d.ptr;
  (this->peerVerifyName).d.size = (other->peerVerifyName).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

QHttpNetworkRequestPrivate::QHttpNetworkRequestPrivate(const QHttpNetworkRequestPrivate &other) // = default
    : QHttpNetworkHeaderPrivate(other),
      operation(other.operation),
      customVerb(other.customVerb),
      fullLocalServerName(other.fullLocalServerName),
      priority(other.priority),
      uploadByteDevice(other.uploadByteDevice),
      autoDecompress(other.autoDecompress),
      pipeliningAllowed(other.pipeliningAllowed),
      http2Allowed(other.http2Allowed),
      http2Direct(other.http2Direct),
      h2cAllowed(other.h2cAllowed),
      withCredentials(other.withCredentials),
      ssl(other.ssl),
      preConnect(other.preConnect),
      needResendWithCredentials(other.needResendWithCredentials),
      redirectCount(other.redirectCount),
      redirectPolicy(other.redirectPolicy),
      peerVerifyName(other.peerVerifyName)
{
}